

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

optional<tinyusdz::Animatable<bool>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<bool>
          (optional<tinyusdz::Animatable<bool>_> *__return_storage_ptr__,PrimVar *var)

{
  TimeSamples *this;
  vtable_type *pvVar1;
  bool bVar2;
  optional<bool> oVar3;
  uint32_t uVar4;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined6 extraout_var_00;
  ulong uVar6;
  optional<tinyusdz::Animatable<bool>_> *extraout_RAX;
  undefined8 uVar7;
  long lVar8;
  pointer pSVar9;
  ulong uVar10;
  optional<bool> pv;
  undefined1 local_64 [2];
  storage_union local_62;
  TypedTimeSamples<bool> local_50;
  optional<tinyusdz::Animatable<bool>_> *poVar5;
  
  local_62._10_3_ = 0;
  local_50._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_50._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_50._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_50._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_50._dirty = false;
  bVar2 = primvar::PrimVar::is_valid(var);
  poVar5 = (optional<tinyusdz::Animatable<bool>_> *)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    if ((var->_blocked == false) && (pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)
       ) {
      uVar4 = (*pvVar1->type_id)();
      poVar5 = (optional<tinyusdz::Animatable<bool>_> *)CONCAT44(extraout_var_01,uVar4);
      if (uVar4 != 0) {
        pvVar1 = (var->_value).v_.vtable;
        if (pvVar1 != (vtable_type *)0x0) {
          uVar4 = (*pvVar1->type_id)();
          poVar5 = (optional<tinyusdz::Animatable<bool>_> *)CONCAT44(extraout_var_02,uVar4);
          if (uVar4 == 1) goto LAB_0024244c;
        }
        goto LAB_00242411;
      }
LAB_0024244c:
      pSVar9 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish == pSVar9) goto LAB_00242537;
LAB_0024245a:
      this = &var->_ts;
      lVar8 = 0;
      uVar10 = 0;
      local_62._2_8_ = __return_storage_ptr__;
      do {
        if ((var->_ts)._dirty == true) {
          tinyusdz::value::TimeSamples::update(this);
          pSVar9 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((&pSVar9->blocked)[lVar8] == true) {
          TypedTimeSamples<bool>::add_blocked_sample
                    (&local_50,*(double *)((long)&pSVar9->t + lVar8));
        }
        else {
          tinyusdz::value::Value::get_value<bool>
                    ((Value *)&local_62,(bool)((char)lVar8 + (char)pSVar9 + '\b'));
          local_64[0] = local_62._0_1_;
          if (local_62._0_1_ != '\x01') {
            *(undefined1 *)local_62._2_8_ = 0;
            *(undefined8 *)(local_62._2_8_ + 8) = 0;
            *(undefined8 *)(local_62._2_8_ + 0x10) = 0;
            *(undefined8 *)(local_62._2_8_ + 0x18) = 0;
            *(undefined8 *)(local_62._2_8_ + 0x20) = 0;
            *(undefined8 *)(local_62._2_8_ + 0x28) = 0;
            if (local_50._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              return (optional<tinyusdz::Animatable<bool>_> *)local_62._2_8_;
            }
            operator_delete(local_50._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(local_50._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     local_50._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                            (long)local_50._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            return extraout_RAX;
          }
          local_64[1] = local_62._1_1_;
          TypedTimeSamples<bool>::add_sample
                    (&local_50,*(double *)((long)&pSVar9->t + lVar8),(bool *)(local_64 + 1));
        }
        uVar10 = uVar10 + 1;
        pSVar9 = (this->_samples).
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(var->_ts)._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9 >> 3) *
                -0x3333333333333333;
        lVar8 = lVar8 + 0x28;
      } while (uVar10 < uVar6);
      uVar7 = CONCAT71(local_50._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                       local_50._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
      poVar5 = (optional<tinyusdz::Animatable<bool>_> *)CONCAT71((int7)(uVar6 >> 8),local_50._dirty)
      ;
      __return_storage_ptr__ = (optional<tinyusdz::Animatable<bool>_> *)local_62._2_8_;
    }
    else {
LAB_00242411:
      oVar3 = primvar::PrimVar::get_value<bool>((PrimVar *)local_64);
      poVar5 = (optional<tinyusdz::Animatable<bool>_> *)CONCAT62(extraout_var_00,oVar3);
      if (local_64[0] == '\0') goto LAB_0024244c;
      local_62._11_2_ = 1;
      local_62._10_1_ = local_64[1];
      pSVar9 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar9) goto LAB_0024245a;
      local_50._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_50._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._4_1_ = false;
      local_50._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._5_3_ = 0;
      local_50._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_50._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      poVar5 = (optional<tinyusdz::Animatable<bool>_> *)0x0;
      uVar7 = 0;
    }
    __return_storage_ptr__->has_value_ = true;
    *(undefined2 *)&__return_storage_ptr__->contained = local_62._10_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->contained + 2) = local_62._12_1_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) =
         local_50._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) =
         local_50._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x10) =
         local_50._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x14) =
         local_50._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = uVar7;
    *(char *)((long)&__return_storage_ptr__->contained + 0x20) = (char)poVar5;
  }
  else {
LAB_00242537:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
  }
  return poVar5;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}